

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-xml.c
# Opt level: O3

int coda_xml_cursor_set_product(coda_cursor *cursor,coda_product *product)

{
  cursor->product = product;
  cursor->n = 1;
  cursor->stack[0].type = product->root_type;
  cursor->stack[0].index = -1;
  cursor->stack[0].bit_offset = 0;
  return 0;
}

Assistant:

int coda_xml_cursor_set_product(coda_cursor *cursor, coda_product *product)
{
    cursor->product = product;
    cursor->n = 1;
    cursor->stack[0].type = product->root_type;
    cursor->stack[0].index = -1;        /* there is no index for the root of the product */
    cursor->stack[0].bit_offset = 0;
    return 0;
}